

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.hpp
# Opt level: O3

void __thiscall qe::Loader<7U>::load(Loader<7U> *this)

{
  uint uVar1;
  long lVar2;
  pointer pcVar3;
  anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3 aVar4;
  int iVar5;
  istream *piVar6;
  ulong uVar7;
  loader_error *plVar8;
  long *plVar9;
  size_type *psVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  vector<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  indices;
  string line;
  value_type local_4c0;
  vec3 v;
  undefined4 uStack_484;
  anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3 local_480;
  undefined1 *local_478 [2];
  undefined1 local_468 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tnormals;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  tvertices;
  long *local_3d8 [2];
  long local_3c8 [2];
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358;
  ulong local_350;
  long local_348 [2];
  long *local_338;
  ulong local_330;
  long local_328 [2];
  long *local_318;
  ulong local_310;
  long local_308 [2];
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  long *local_278;
  ulong local_270;
  long local_268 [2];
  string local_258;
  ifstream file;
  undefined4 uStack_21c;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&file,(string *)&this->_path,_S_in);
  lVar2 = *(long *)(_file + -0x18);
  *(undefined4 *)((long)&uStack_21c + lVar2) = 1;
  std::ios::clear((int)&indices + (int)lVar2 + 0x2c0);
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tvertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tnormals.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indices.
  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c0.name._M_dataplus._M_p = (pointer)&local_4c0.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"");
  local_4c0.index = 0;
  local_4c0.size = 0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
LAB_0015f71c:
  do {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&file,(string *)&line,'\n');
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)line._M_dataplus._M_p != &line.field_2) {
        operator_delete(line._M_dataplus._M_p,
                        CONCAT71(line.field_2._M_allocated_capacity._1_7_,
                                 line.field_2._M_local_buf[0]) + 1);
      }
      local_4c0.size =
           ((long)indices.
                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)indices.
                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) - local_4c0.index;
      if (local_4c0.name._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_4c0,0,(char *)0x0,0x1b9edb);
      }
      std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back
                (&this->_objects,&local_4c0);
      if ((abStack_218[*(long *)(_file + -0x18)] & 1) != 0) {
        plVar8 = (loader_error *)__cxa_allocate_exception(0x10);
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        pcVar3 = (this->_path)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,pcVar3,pcVar3 + (this->_path)._M_string_length);
        loader_error::loader_error
                  (plVar8,&local_258,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                   ,0x135);
        __cxa_throw(plVar8,&loader_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((long)indices.
                super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)indices.
                super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        plVar8 = (loader_error *)__cxa_allocate_exception(0x10);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        pcVar3 = (this->_path)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&line,pcVar3,pcVar3 + (this->_path)._M_string_length);
        plVar9 = (long *)std::__cxx11::string::append((char *)&line);
        local_2f8._M_dataplus._M_p = (pointer)*plVar9;
        psVar10 = (size_type *)(plVar9 + 2);
        if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
          local_2f8.field_2._M_allocated_capacity = *psVar10;
          local_2f8.field_2._8_8_ = plVar9[3];
          local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        }
        else {
          local_2f8.field_2._M_allocated_capacity = *psVar10;
        }
        local_2f8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        loader_error::loader_error
                  (plVar8,&local_2f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                   ,0x137);
        __cxa_throw(plVar8,&loader_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (0x5555555555555555 <
          (ulong)(((long)indices.
                         super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)indices.
                         super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        __assert_fail("indices.size() % 3 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                      ,0x139,"void qe::Loader<7>::load()");
      }
      uVar7 = 0;
      uVar13 = 1;
      while( true ) {
        uVar11 = indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].field_0.field_0.x;
        if ((ulong)(((long)tvertices.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tvertices.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
            (ulong)uVar11) {
          __assert_fail("indices[i].x <= tvertices.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                        ,0x13c,"void qe::Loader<7>::load()");
        }
        uVar1 = indices.
                super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar7].field_0.field_0.y;
        if ((ulong)(((long)tnormals.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)tnormals.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
            (ulong)uVar1) break;
        std::vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>>::
        emplace_back<glm::vec<3,float,(glm::qualifier)0>&,glm::vec<3,float,(glm::qualifier)0>&>
                  ((vector<qe::objv3_point_t,std::allocator<qe::objv3_point_t>> *)this,
                   tvertices.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar11 + -1,
                   tnormals.
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)(int)uVar1 + -1);
        bVar14 = (ulong)((long)indices.
                               super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)indices.
                               super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar13;
        uVar7 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
        if (bVar14) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0.name._M_dataplus._M_p != &local_4c0.name.field_2) {
            operator_delete(local_4c0.name._M_dataplus._M_p,
                            local_4c0.name.field_2._M_allocated_capacity + 1);
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(indices.
                            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)indices.
                                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)indices.
                                  super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (tnormals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tnormals.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)tnormals.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)tnormals.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (tvertices.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(tvertices.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)tvertices.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)tvertices.
                                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::ifstream::~ifstream(&file);
          return;
        }
      }
      __assert_fail("indices[i].y <= tnormals.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                    ,0x13d,"void qe::Loader<7>::load()");
    }
    local_378[0] = local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_378,line._M_dataplus._M_p,
               line._M_dataplus._M_p + line._M_string_length);
    local_278 = local_268;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"v ","");
    if (local_270 == 0) {
      bVar14 = true;
    }
    else {
      uVar11 = 1;
      uVar7 = 0;
      do {
        bVar14 = *(char *)((long)local_378[0] + uVar7) == *(char *)((long)local_278 + uVar7);
        if (!bVar14) break;
        uVar7 = (ulong)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar7 < local_270);
    }
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    if (local_378[0] != local_368) {
      operator_delete(local_378[0],local_368[0] + 1);
    }
    if (!bVar14) {
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_398,line._M_dataplus._M_p,
                 line._M_dataplus._M_p + line._M_string_length);
      local_318 = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"vn ","");
      if (local_310 == 0) {
        bVar14 = true;
      }
      else {
        uVar11 = 1;
        uVar7 = 0;
        do {
          bVar14 = *(char *)((long)local_398[0] + uVar7) == *(char *)((long)local_318 + uVar7);
          if (!bVar14) break;
          uVar7 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
        } while (uVar7 < local_310);
      }
      if (local_318 != local_308) {
        operator_delete(local_318,local_308[0] + 1);
      }
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      if (bVar14) {
        iVar5 = __isoc99_sscanf(line._M_dataplus._M_p,"vn %f %f %f",&v,
                                (undefined1 *)((long)&v.field_0 + 4),
                                (undefined1 *)((long)&v.field_0 + 8));
        if (iVar5 + 1U < 2) {
          plVar8 = (loader_error *)__cxa_allocate_exception(0x10);
          local_478[0] = local_468;
          pcVar3 = (this->_path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_478,pcVar3,pcVar3 + (this->_path)._M_string_length);
          plVar9 = (long *)std::__cxx11::string::append((char *)local_478);
          local_438._M_dataplus._M_p = (pointer)*plVar9;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_438._M_dataplus._M_p == psVar10) {
            local_438.field_2._M_allocated_capacity = *psVar10;
            local_438.field_2._8_8_ = plVar9[3];
            local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
          }
          else {
            local_438.field_2._M_allocated_capacity = *psVar10;
          }
          local_438._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::operator+(&local_458,&local_438,&line);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_458);
          local_2b8._M_dataplus._M_p = (pointer)*plVar9;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
            local_2b8.field_2._M_allocated_capacity = *psVar10;
            local_2b8.field_2._8_8_ = plVar9[3];
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          }
          else {
            local_2b8.field_2._M_allocated_capacity = *psVar10;
          }
          local_2b8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          loader_error::loader_error
                    (plVar8,&local_2b8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                     ,0x115);
          __cxa_throw(plVar8,&loader_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (tnormals.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            tnormals.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
          ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                    ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                      *)&tnormals,
                     (iterator)
                     tnormals.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&v);
        }
        else {
          ((tnormals.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->field_0).field_0.z = v.field_0.field_0.z;
          *(undefined8 *)
           &(tnormals.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 = v.field_0._0_8_;
          tnormals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               tnormals.
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        local_3b8[0] = local_3a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3b8,line._M_dataplus._M_p,
                   line._M_dataplus._M_p + line._M_string_length);
        local_338 = local_328;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"f ","");
        if (local_330 == 0) {
          bVar14 = true;
        }
        else {
          uVar11 = 1;
          uVar7 = 0;
          do {
            bVar14 = *(char *)((long)local_3b8[0] + uVar7) == *(char *)((long)local_338 + uVar7);
            if (!bVar14) break;
            uVar7 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar7 < local_330);
        }
        if (local_338 != local_328) {
          operator_delete(local_338,local_328[0] + 1);
        }
        if (local_3b8[0] != local_3a8) {
          operator_delete(local_3b8[0],local_3a8[0] + 1);
        }
        if (bVar14) {
          iVar5 = __isoc99_sscanf(line._M_dataplus._M_p,"f %u//%u %u//%u %u//%u",&v,
                                  (undefined1 *)((long)&v.field_0 + 4),
                                  (undefined1 *)((long)&v.field_0 + 8),&uStack_484,&local_480,
                                  &local_480.field_0.y);
          if (iVar5 + 1U < 2) {
            plVar8 = (loader_error *)__cxa_allocate_exception(0x10);
            local_478[0] = local_468;
            pcVar3 = (this->_path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_478,pcVar3,pcVar3 + (this->_path)._M_string_length);
            plVar9 = (long *)std::__cxx11::string::append((char *)local_478);
            local_438._M_dataplus._M_p = (pointer)*plVar9;
            psVar10 = (size_type *)(plVar9 + 2);
            if ((size_type *)local_438._M_dataplus._M_p == psVar10) {
              local_438.field_2._M_allocated_capacity = *psVar10;
              local_438.field_2._8_8_ = plVar9[3];
              local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
            }
            else {
              local_438.field_2._M_allocated_capacity = *psVar10;
            }
            local_438._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::operator+(&local_458,&local_438,&line);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_458);
            local_2d8._M_dataplus._M_p = (pointer)*plVar9;
            psVar10 = (size_type *)(plVar9 + 2);
            if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
              local_2d8.field_2._M_allocated_capacity = *psVar10;
              local_2d8.field_2._8_8_ = plVar9[3];
              local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            }
            else {
              local_2d8.field_2._M_allocated_capacity = *psVar10;
            }
            local_2d8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar10;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            loader_error::loader_error
                      (plVar8,&local_2d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                       ,0x122);
            __cxa_throw(plVar8,&loader_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,unsigned_int,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
                        *)&indices,
                       (iterator)
                       indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<2,_unsigned_int,_(glm::qualifier)0> *)&v);
          }
          else {
            (indices.
             super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 =
                 (anon_union_8_3_e2189aaa_for_vec<2,_unsigned_int,_(glm::qualifier)0>_3)
                 v.field_0._0_8_;
            indices.
            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,unsigned_int,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
                        *)&indices,
                       (iterator)
                       indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<2,_unsigned_int,_(glm::qualifier)0> *)((long)&v.field_0 + 8));
          }
          else {
            aVar4.field_0.y = uStack_484;
            aVar4.field_0.x = (uint)v.field_0.field_0.z;
            (indices.
             super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 = aVar4;
            indices.
            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              indices.
              super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
            ::_M_realloc_insert<glm::vec<2,unsigned_int,(glm::qualifier)0>const&>
                      ((vector<glm::vec<2,unsigned_int,(glm::qualifier)0>,std::allocator<glm::vec<2,unsigned_int,(glm::qualifier)0>>>
                        *)&indices,
                       (iterator)
                       indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (vec<2,_unsigned_int,_(glm::qualifier)0> *)&local_480.field_0);
          }
          else {
            (indices.
             super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0 = local_480;
            indices.
            super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 indices.
                 super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_3d8[0] = local_3c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d8,line._M_dataplus._M_p,
                     line._M_dataplus._M_p + line._M_string_length);
          local_358 = local_348;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"o ","");
          if (local_350 == 0) {
            bVar14 = true;
          }
          else {
            uVar7 = 1;
            uVar13 = 0;
            do {
              uVar12 = uVar7;
              bVar14 = *(char *)((long)local_3d8[0] + uVar13) == *(char *)((long)local_358 + uVar13)
              ;
              if (!bVar14) break;
              uVar7 = (ulong)((int)uVar12 + 1);
              uVar13 = uVar12;
            } while (uVar12 < local_350);
          }
          if (local_358 != local_348) {
            operator_delete(local_358,local_348[0] + 1);
          }
          if (local_3d8[0] != local_3c8) {
            operator_delete(local_3d8[0],local_3c8[0] + 1);
          }
          if (bVar14) {
            local_4c0.size =
                 ((long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)indices.
                        super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) - local_4c0.index;
            if (local_4c0.name._M_string_length == 0) {
              std::__cxx11::string::_M_replace((ulong)&local_4c0,0,(char *)0x0,0x1b9ed6);
            }
            std::vector<qe::subobj_t,_std::allocator<qe::subobj_t>_>::push_back
                      (&this->_objects,&local_4c0);
            std::__cxx11::string::substr((ulong)&local_458,(ulong)&line);
            std::__cxx11::string::operator=((string *)&local_4c0,(string *)&local_458);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_458._M_dataplus._M_p != &local_458.field_2) {
              operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1
                             );
            }
            local_4c0.index =
                 (long)indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)indices.
                       super__Vector_base<glm::vec<2,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
          }
        }
      }
      goto LAB_0015f71c;
    }
    iVar5 = __isoc99_sscanf(line._M_dataplus._M_p,"v %f %f %f",&v,
                            (undefined1 *)((long)&v.field_0 + 4),
                            (undefined1 *)((long)&v.field_0 + 8));
    if (iVar5 + 1U < 2) {
      plVar8 = (loader_error *)__cxa_allocate_exception(0x10);
      local_478[0] = local_468;
      pcVar3 = (this->_path)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_478,pcVar3,pcVar3 + (this->_path)._M_string_length);
      plVar9 = (long *)std::__cxx11::string::append((char *)local_478);
      local_438._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_438._M_dataplus._M_p == psVar10) {
        local_438.field_2._M_allocated_capacity = *psVar10;
        local_438.field_2._8_8_ = plVar9[3];
        local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      }
      else {
        local_438.field_2._M_allocated_capacity = *psVar10;
      }
      local_438._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::operator+(&local_458,&local_438,&line);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_458);
      local_298._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
        local_298.field_2._M_allocated_capacity = *psVar10;
        local_298.field_2._8_8_ = plVar9[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar10;
      }
      local_298._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      loader_error::loader_error
                (plVar8,&local_298,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/loader.hpp"
                 ,0x10b);
      __cxa_throw(plVar8,&loader_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (tvertices.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        tvertices.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
      ::_M_realloc_insert<glm::vec<3,float,(glm::qualifier)0>const&>
                ((vector<glm::vec<3,float,(glm::qualifier)0>,std::allocator<glm::vec<3,float,(glm::qualifier)0>>>
                  *)&tvertices,
                 (iterator)
                 tvertices.
                 super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&v);
    }
    else {
      ((tvertices.
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->field_0).field_0.z = v.field_0.field_0.z;
      *(undefined8 *)
       &(tvertices.
         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_0 = v.field_0._0_8_;
      tvertices.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           tvertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  } while( true );
}

Assistant:

void load() {
            std::ifstream file(_path);
            file.exceptions(std::ifstream::badbit);
            std::vector<glm::vec3> tvertices;
            std::vector<glm::vec3> tnormals;
            std::vector<glm::uvec2> indices;

            subobj_t tobj {"", 0, 0};

            for(std::string line; std::getline(file, line, '\n');) {
                if(startswith(line, "v ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "v %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tvertices.push_back(v);
                } else if(startswith(line, "vn ")) {
                    glm::vec3 v;

                    switch(sscanf(line.c_str(), "vn %f %f %f", &v.x, &v.y, &v.z)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + "(" + line + ")", __FILE__, __LINE__);
                    }

                    tnormals.push_back(v);
                } else if(startswith(line, "f ")) {
                    std::array<glm::uvec2, 3> points;

                    switch(sscanf(line.c_str(), "f %u//%u %u//%u %u//%u",
                                  &points[0].x, &points[0].y,
                                  &points[1].x, &points[1].y,
                                  &points[2].x, &points[2].y)) {
                    case 0:
                    case EOF:
                        throw loader_error(std::string(_path) + " (" + line + ")", __FILE__, __LINE__);
                    }

                    indices.push_back(points[0]);
                    indices.push_back(points[1]);
                    indices.push_back(points[2]);
                } else if(startswith(line, "o ")) {
                    tobj.size = indices.size() - tobj.index;
                    if(tobj.name.empty()) tobj.name = "FIRSTNONAME";
                    _objects.push_back(tobj);
                    tobj.name = line.substr(2);
                    tobj.index = indices.size();
                }
            }

            tobj.size = indices.size() - tobj.index;
            if(tobj.name.empty()) tobj.name = "NONAME";
            _objects.push_back(tobj);

            if(file.bad()) throw loader_error(_path, __FILE__, __LINE__);

            if(indices.size() == 0) throw loader_error(std::string(_path) + " (no indices found)", __FILE__, __LINE__);

            assert(indices.size() % 3 == 0);

            for(unsigned int i = 0; i < indices.size(); ++i) {
                assert(indices[i].x <= tvertices.size());
                assert(indices[i].y <= tnormals.size());
                glm::ivec2 index = indices[i];
                _points.emplace_back(tvertices[index.x - 1], tnormals[index.y - 1]);
            }
        }